

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O0

string * ylt::metric::manager_helper::serialize_abi_cxx11_
                   (vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
                    *metrics)

{
  bool bVar1;
  element_type *peVar2;
  undefined8 in_RSI;
  string *in_RDI;
  shared_ptr<ylt::metric::metric_t> *m;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  *__range2;
  string *str;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  __normal_iterator<const_std::shared_ptr<ylt::metric::metric_t>_*,_std::vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>_>
  local_28;
  undefined8 local_20;
  undefined1 local_11;
  undefined8 local_10;
  
  local_11 = 0;
  __lhs = in_RDI;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_stack_ffffffffffffffc0);
  local_20 = local_10;
  local_28._M_current =
       (shared_ptr<ylt::metric::metric_t> *)
       std::
       vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
       ::begin((vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
                *)in_RDI);
  std::
  vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
  ::end((vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>
         *)in_RDI);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::shared_ptr<ylt::metric::metric_t>_*,_std::vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>_>
                           ((__normal_iterator<const_std::shared_ptr<ylt::metric::metric_t>_*,_std::vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>_>
                             *)__lhs,(__normal_iterator<const_std::shared_ptr<ylt::metric::metric_t>_*,_std::vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>_>
                                      *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<ylt::metric::metric_t>_*,_std::vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>_>
    ::operator*(&local_28);
    peVar2 = std::
             __shared_ptr_access<ylt::metric::metric_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ylt::metric::metric_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1ed02c);
    (*peVar2->_vptr_metric_t[7])(peVar2,in_RDI);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<ylt::metric::metric_t>_*,_std::vector<std::shared_ptr<ylt::metric::metric_t>,_std::allocator<std::shared_ptr<ylt::metric::metric_t>_>_>_>
    ::operator++(&local_28);
  }
  return __lhs;
}

Assistant:

static std::string serialize(
      const std::vector<std::shared_ptr<metric_t>>& metrics) {
    std::string str;
    for (auto& m : metrics) {
      m->serialize(str);
    }
    return str;
  }